

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Path * kj::Path::parse(StringPtr path)

{
  undefined8 uVar1;
  ArrayDisposer *pAVar2;
  ArrayDisposer *pAVar3;
  char *in_RDX;
  char *pcVar4;
  Vector<kj::String> *in_RSI;
  Path *in_RDI;
  size_t sVar5;
  size_t capacity;
  StringPtr path_00;
  undefined1 local_48 [24];
  ArrayDisposer *pAStack_30;
  ArrayDisposer *local_28;
  undefined8 *local_20;
  
  local_48._0_8_ = in_RSI;
  local_48._8_8_ = in_RDX;
  if (((char *)0x1 < in_RDX) && (*(char *)&(in_RSI->builder).ptr == '/')) {
    parse((Path *)local_48);
  }
  if ((Vector<kj::String> *)
      (local_48._8_8_ +
      (long)((long)&(((Vector<kj::String> *)(local_48._0_8_ + -0x20))->builder).disposer + 7)) ==
      (Vector<kj::String> *)local_48._0_8_) {
    capacity = 1;
  }
  else {
    capacity = 1;
    pcVar4 = (char *)0x0;
    do {
      capacity = capacity + (pcVar4[(long)(ArrayBuilder<kj::String> *)local_48._0_8_] == '/');
      pcVar4 = pcVar4 + 1;
    } while ((char *)(local_48._8_8_ + -1) != pcVar4);
  }
  sVar5 = 0;
  local_48._16_8_ =
       kj::_::HeapArrayDisposer::allocateImpl
                 (0x18,0,capacity,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_28 = (ArrayDisposer *)(local_48._16_8_ + capacity * 3 * 8);
  local_20 = &kj::_::HeapArrayDisposer::instance;
  path_00.content.size_ = sVar5;
  path_00.content.ptr = (char *)local_48._8_8_;
  pAStack_30 = (ArrayDisposer *)local_48._16_8_;
  evalImpl(in_RDI,(Path *)(local_48 + 0x10),(Vector<kj::String> *)local_48._0_8_,path_00);
  pAVar3 = local_28;
  pAVar2 = pAStack_30;
  uVar1 = local_48._16_8_;
  if ((ArrayDisposer *)local_48._16_8_ != (ArrayDisposer *)0x0) {
    local_48._16_8_ = (ArrayDisposer *)0x0;
    pAStack_30 = (ArrayDisposer *)0x0;
    local_28 = (ArrayDisposer *)0x0;
    (**(code **)*local_20)
              (local_20,uVar1,0x18,((long)pAVar2 - uVar1 >> 3) * -0x5555555555555555,
               ((long)pAVar3 - uVar1 >> 3) * -0x5555555555555555,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return in_RDI;
}

Assistant:

Path Path::parse(StringPtr path) {
  KJ_REQUIRE(!path.startsWith("/"), "expected a relative path, got absolute", path) {
    // When exceptions are disabled, go on -- the leading '/' will end up ignored.
    break;
  }
  return evalImpl(Vector<String>(countParts(path)), path);
}